

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

UBool icu_63::BytesTrie::findUniqueValue(uint8_t *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  bool bVar2;
  int32_t iVar3;
  UBool unaff_BL;
  byte *pos_00;
  
  do {
    pos_00 = pos + 1;
    bVar1 = *pos;
    if (bVar1 < 0x10) {
      if ((ulong)bVar1 == 0) {
        bVar1 = pos[1];
        pos_00 = pos + 2;
      }
      pos_00 = findUniqueValueFromBranch(pos_00,bVar1 + 1,haveUniqueValue,uniqueValue);
      if (pos_00 == (byte *)0x0) {
        bVar2 = false;
        unaff_BL = '\0';
        pos = (byte *)0x0;
      }
      else {
        haveUniqueValue = '\x01';
LAB_0038a9a3:
        bVar2 = true;
        pos = pos_00;
      }
    }
    else {
      if (bVar1 < 0x20) {
        pos_00 = pos_00 + ((ulong)bVar1 - 0xf);
        goto LAB_0038a9a3;
      }
      iVar3 = readValue(pos_00,(uint)(bVar1 >> 1));
      if (haveUniqueValue == '\0') {
        *uniqueValue = iVar3;
        haveUniqueValue = '\x01';
LAB_0038a965:
        if ((bVar1 & 1) == 0) {
          bVar2 = true;
          if (0xa1 < bVar1) {
            if (bVar1 < 0xd8) {
              pos_00 = pos + 2;
            }
            else if (bVar1 < 0xfc) {
              pos_00 = pos + 3;
            }
            else {
              pos_00 = pos_00 + (ulong)(bVar1 >> 1 & 1) + 3;
            }
          }
        }
        else {
          unaff_BL = '\x01';
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
        if (iVar3 == *uniqueValue) goto LAB_0038a965;
        unaff_BL = '\0';
      }
      if (bVar2) goto LAB_0038a9a3;
      bVar2 = false;
      pos = pos_00;
    }
    if (!bVar2) {
      return unaff_BL;
    }
  } while( true );
}

Assistant:

UBool
BytesTrie::findUniqueValue(const uint8_t *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match bytes.
        } else {
            UBool isFinal=(UBool)(node&kValueIsFinal);
            int32_t value=readValue(pos, node>>1);
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipValue(pos, node);
        }
    }
}